

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int choice;
  int local_2c;
  
  local_2c = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Welcome! Please choose one of the various algorithms implemented:");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = 0;
  while (iVar1 != 5) {
    std::operator<<((ostream *)&std::cout,"1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n");
    std::istream::operator>>((istream *)&std::cin,&local_2c);
    iVar1 = local_2c;
    switch(local_2c) {
    case 1:
      DFS();
      iVar1 = local_2c;
      break;
    case 2:
      BFS();
      iVar1 = local_2c;
      break;
    case 3:
      BestFirst();
      iVar1 = local_2c;
      break;
    case 4:
      Astar();
      iVar1 = local_2c;
    }
  }
  return 0;
}

Assistant:

int main() {
    int choice = 0;
    std::cout << "Welcome! Please choose one of the various algorithms implemented:" << std::endl;
    while (choice != 5) {
        std::cout << "1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n";
        std::cin >> choice;
        if (choice == 1) {
            DFS();
        } else if (choice == 2) {
            BFS();
        } else if (choice == 3) {
            BestFirst();
        } else if (choice == 4) {
            Astar();
        }
    }
    return 0;
}